

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulateutil.cc
# Opt level: O0

void __thiscall EmulateSnippet::executeBranchind(EmulateSnippet *this)

{
  OpCode opc;
  LowlevelError *this_00;
  char *pcVar1;
  allocator local_5d [13];
  string local_50 [32];
  string local_30 [32];
  EmulateSnippet *local_10;
  EmulateSnippet *this_local;
  
  local_10 = this;
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  opc = PcodeOpRaw::getOpcode(this->currentOp);
  pcVar1 = get_opname(opc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,local_5d);
  std::operator+((char *)local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Illegal p-code operation in snippet: ");
  LowlevelError::LowlevelError(this_00,local_30);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void EmulateSnippet::executeBranchind(void)

{
  throw LowlevelError("Illegal p-code operation in snippet: "+ (string)get_opname(currentOp->getOpcode()));
}